

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

String * __thiscall Lexer::describeCurrentPosition(String *__return_storage_ptr__,Lexer *this)

{
  TokenInfo *pTVar1;
  String local_30;
  
  pTVar1 = token(this);
  String::operator+(&local_30,&pTVar1->file,":");
  pTVar1 = token(this);
  String::operator+(__return_storage_ptr__,&local_30,pTVar1->line);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

String Lexer::describeCurrentPosition()
{
	return token()->file + ":" + token()->line;
}